

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListAndAPITest::getBufferDescriptors
          (XFBStrideOfEmptyListAndAPITest *this,GLuint test_case_index,Vector *out_descriptors)

{
  value_type vVar1;
  reference pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  reference local_c0;
  bufferDescriptor *xfb_0_1;
  bufferDescriptor *uniform_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  reference local_80;
  bufferDescriptor *xfb_1_1;
  bufferDescriptor *uniform_1;
  uint local_54;
  undefined1 local_50 [4];
  GLuint i;
  reference local_38;
  bufferDescriptor *xfb_1;
  bufferDescriptor *xfb_0;
  bufferDescriptor *uniform;
  Vector *out_descriptors_local;
  XFBStrideOfEmptyListAndAPITest *pXStack_10;
  GLuint test_case_index_local;
  XFBStrideOfEmptyListAndAPITest *this_local;
  
  uniform = (bufferDescriptor *)out_descriptors;
  out_descriptors_local._4_4_ = test_case_index;
  pXStack_10 = this;
  if (test_case_index == 0) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,3);
    xfb_0 = std::
            vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
            ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                          *)uniform,0);
    xfb_1 = std::
            vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
            ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                          *)uniform,1);
    local_38 = std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)uniform,2);
    xfb_0->m_index = 0;
    xfb_1->m_index = 0;
    local_38->m_index = 1;
    xfb_0->m_target = Uniform;
    xfb_1->m_target = Transform_feedback;
    local_38->m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&xfb_0->m_initial_data,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_1->m_initial_data,0x40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_1->m_expected_data,0x40)
    ;
    for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 1) {
      vVar1 = (value_type)local_54;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&xfb_1->m_initial_data,0);
      *pvVar2 = vVar1;
      vVar1 = (value_type)local_54;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&xfb_1->m_expected_data,0);
      *pvVar2 = vVar1;
    }
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_1,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_38->m_initial_data,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_38->m_expected_data,&xfb_0->m_initial_data);
  }
  else if (test_case_index == 1) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,2);
    xfb_1_1 = std::
              vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
              ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                            *)uniform,0);
    local_80 = std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)uniform,1);
    xfb_1_1->m_index = 0;
    local_80->m_index = 1;
    xfb_1_1->m_target = Uniform;
    local_80->m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked(&local_98,(Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&xfb_1_1->m_initial_data,&local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_2,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_80->m_initial_data,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&uniform_2);
  }
  else if (test_case_index == 2) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,2);
    xfb_0_1 = std::
              vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
              ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                            *)uniform,0);
    local_c0 = std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)uniform,1);
    xfb_0_1->m_index = 0;
    local_c0->m_index = 0;
    xfb_0_1->m_target = Uniform;
    local_c0->m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked(&local_d8,(Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&xfb_0_1->m_initial_data,&local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_c0->m_initial_data,0x40);
  }
  return;
}

Assistant:

void XFBStrideOfEmptyListAndAPITest::getBufferDescriptors(glw::GLuint				test_case_index,
														  bufferDescriptor::Vector& out_descriptors)
{
	switch (test_case_index)
	{
	case VALID:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(3);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_0   = out_descriptors[1];
		bufferDescriptor& xfb_1   = out_descriptors[2];

		/* Index */
		uniform.m_index = 0;
		xfb_0.m_index   = 0;
		xfb_1.m_index   = 1;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_0.m_target   = Utils::Buffer::Transform_feedback;
		xfb_1.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Data, contents are the same as no modification is expected */
		xfb_0.m_initial_data.resize(m_stride);
		xfb_0.m_expected_data.resize(m_stride);

		for (GLuint i = 0; i < m_stride; ++i)
		{
			xfb_0.m_initial_data[0]  = (glw::GLubyte)i;
			xfb_0.m_expected_data[0] = (glw::GLubyte)i;
		}

		xfb_1.m_initial_data  = Utils::Type::vec4.GenerateDataPacked();
		xfb_1.m_expected_data = uniform.m_initial_data;
	}

	break;

	case FIRST_MISSING:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(2);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_1   = out_descriptors[1];

		/* Index */
		uniform.m_index = 0;
		xfb_1.m_index   = 1;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_1.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Draw call will not be executed, contents does not matter */
		xfb_1.m_initial_data = Utils::Type::vec4.GenerateDataPacked();
	}

	break;

	case SECOND_MISSING:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(2);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_0   = out_descriptors[1];

		/* Index */
		uniform.m_index = 0;
		xfb_0.m_index   = 0;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_0.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Draw call will not be executed, contents does not matter */
		xfb_0.m_initial_data.resize(m_stride);
	}

	break;
	}
}